

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::SetDeviceOptions(DROPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  pointer pDVar1;
  UINT8 UVar2;
  size_t sVar3;
  
  sVar3 = DeviceID2OptionID(this,id);
  if (sVar3 == 0xffffffffffffffff) {
    UVar2 = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar3,devOpts,0xa0);
    pDVar1 = (this->_devices).
             super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (this->_optDevMap[sVar3] <
        (ulong)(((long)(this->_devices).
                       super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0xa8)) {
      RefreshMuting((DROPlayer *)0xa8,pDVar1 + this->_optDevMap[sVar3],
                    &this->_devOpts[sVar3].muteOpts);
    }
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UINT8 DROPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	// no immediate changes necessary for OPL2/OPL3
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}